

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ArrayColumnData::ScanCount
          (ArrayColumnData *this,ColumnScanState *state,Vector *result,idx_t count,
          idx_t result_offset)

{
  vector<duckdb::ColumnScanState,_true> *this_00;
  reference pvVar1;
  idx_t iVar2;
  idx_t iVar3;
  Vector *pVVar4;
  pointer pCVar5;
  ColumnData *this_01;
  
  this_00 = &state->child_states;
  this_01 = (ColumnData *)this_00;
  pvVar1 = vector<duckdb::ColumnScanState,_true>::get<true>(this_00,0);
  iVar2 = ColumnData::ScanCount(this_01,pvVar1,result,count,result_offset);
  iVar3 = ArrayType::GetSize(&(this->super_ColumnData).type);
  pVVar4 = ArrayVector::GetEntry(result);
  pCVar5 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (&this->child_column);
  pvVar1 = vector<duckdb::ColumnScanState,_true>::get<true>(this_00,1);
  (*pCVar5->_vptr_ColumnData[0xc])(pCVar5,pvVar1,pVVar4,count * iVar3,iVar3 * result_offset);
  return iVar2;
}

Assistant:

idx_t ArrayColumnData::ScanCount(ColumnScanState &state, Vector &result, idx_t count, idx_t result_offset) {
	// Scan validity
	auto scan_count = validity.ScanCount(state.child_states[0], result, count, result_offset);
	auto array_size = ArrayType::GetSize(type);
	// Scan child column
	auto &child_vec = ArrayVector::GetEntry(result);
	child_column->ScanCount(state.child_states[1], child_vec, count * array_size, result_offset * array_size);
	return scan_count;
}